

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_backend.cpp
# Opt level: O1

int __thiscall
basisu::basisu_backend::find_video_frame(basisu_backend *this,int slice_index,int delta)

{
  basisu_backend_slice_desc *pbVar1;
  ulong uVar2;
  bool *pbVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar2 = (ulong)(this->m_slices).m_size;
  if (uVar2 != 0) {
    uVar4 = (ulong)slice_index;
    if (uVar2 <= uVar4) {
      __assert_fail("i < m_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                    ,0x178,
                    "T &basisu::vector<basisu::basisu_backend_slice_desc>::operator[](size_t) [T = basisu::basisu_backend_slice_desc]"
                   );
    }
    pbVar1 = (this->m_slices).m_p;
    pbVar3 = &pbVar1->m_alpha;
    uVar5 = 0;
    do {
      if ((((*(uint32_t *)(pbVar3 + -8) == delta + pbVar1[uVar4].m_source_file_index) &&
           (*(uint32_t *)(pbVar3 + -4) == pbVar1[uVar4].m_mip_index)) &&
          (*(uint32_t *)(pbVar3 + -0x18) == pbVar1[uVar4].m_num_blocks_x)) &&
         ((*(uint32_t *)(pbVar3 + -0x14) == pbVar1[uVar4].m_num_blocks_y &&
          (*pbVar3 == pbVar1[uVar4].m_alpha)))) {
        return (int)uVar5;
      }
      uVar5 = uVar5 + 1;
      pbVar3 = pbVar3 + 0x30;
    } while (uVar2 != uVar5);
  }
  return -1;
}

Assistant:

int basisu_backend::find_video_frame(int slice_index, int delta)
	{
		for (uint32_t s = 0; s < m_slices.size(); s++)
		{
			if ((int)m_slices[s].m_source_file_index != ((int)m_slices[slice_index].m_source_file_index + delta))
				continue;
			if (m_slices[s].m_mip_index != m_slices[slice_index].m_mip_index)
				continue;

			// Being super paranoid here.
			if (m_slices[s].m_num_blocks_x != (m_slices[slice_index].m_num_blocks_x))
				continue;
			if (m_slices[s].m_num_blocks_y != (m_slices[slice_index].m_num_blocks_y))
				continue;
			if (m_slices[s].m_alpha != (m_slices[slice_index].m_alpha))
				continue;
			return s;
		}

		return -1;
	}